

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManCollect_rec(If_DsdMan_t *p,int Id,Vec_Int_t *vNodes,Vec_Int_t *vFirsts,int *pnSupp)

{
  int Entry;
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((Id < 0) || ((p->vObjs).nSize <= Id)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar1 = (p->vObjs).pArray[(uint)Id];
  uVar2 = *(uint *)((long)pvVar1 + 4) & 7;
  if (uVar2 != 1) {
    if (uVar2 != 2) {
      Entry = *pnSupp;
      if (0x7ffffff < *(uint *)((long)pvVar1 + 4)) {
        uVar3 = 0;
        do {
          uVar2 = *(uint *)((long)pvVar1 + uVar3 * 4 + 8);
          if (uVar2 == 0) break;
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          If_DsdManCollect_rec(p,uVar2 >> 1,vNodes,vFirsts,pnSupp);
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)((long)pvVar1 + 4) >> 0x1b);
      }
      Vec_IntPush(vNodes,Id);
      Vec_IntPush(vFirsts,Entry);
      return;
    }
    *pnSupp = *pnSupp + 1;
  }
  return;
}

Assistant:

void If_DsdManCollect_rec( If_DsdMan_t * p, int Id, Vec_Int_t * vNodes, Vec_Int_t * vFirsts, int * pnSupp )
{
    int i, iFanin, iFirst;
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        return;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        (*pnSupp)++;
        return;
    }
    iFirst = *pnSupp;
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManCollect_rec( p, Abc_Lit2Var(iFanin), vNodes, vFirsts, pnSupp );
    Vec_IntPush( vNodes, Id );
    Vec_IntPush( vFirsts, iFirst );
}